

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void store_read_imp(png_store *ps,png_bytep pb,size_t st)

{
  int iVar1;
  size_t sVar2;
  ulong __n;
  
  if ((ps->current != (png_store_file *)0x0) && (ps->next != (png_store_buffer *)0x0)) {
    if (st != 0) {
      do {
        sVar2 = 500;
        if (ps->next == &ps->current->data) {
          sVar2 = ps->current->datacount;
        }
        __n = sVar2 - ps->readpos;
        if (__n == 0) {
          iVar1 = store_read_buffer_next(ps);
          if (iVar1 == 0) {
            png_error(ps->pread,"read beyond end of file");
          }
        }
        else {
          if (st <= __n) {
            __n = st;
          }
          memcpy(pb,ps->next->buffer + ps->readpos,__n);
          st = st - __n;
          pb = pb + __n;
          ps->readpos = ps->readpos + __n;
        }
      } while (st != 0);
    }
    return;
  }
  png_error(ps->pread,"store state damaged");
}

Assistant:

static void
store_read_imp(png_store *ps, png_bytep pb, size_t st)
{
   if (ps->current == NULL || ps->next == NULL)
      png_error(ps->pread, "store state damaged");

   while (st > 0)
   {
      size_t cbAvail = store_read_buffer_size(ps) - ps->readpos;

      if (cbAvail > 0)
      {
         if (cbAvail > st) cbAvail = st;
         memcpy(pb, ps->next->buffer + ps->readpos, cbAvail);
         st -= cbAvail;
         pb += cbAvail;
         ps->readpos += cbAvail;
      }

      else if (!store_read_buffer_next(ps))
         png_error(ps->pread, "read beyond end of file");
   }
}